

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCopyFile(Btree *pTo,Btree *pFrom)

{
  int iVar1;
  u32 uVar2;
  Pager *pPager;
  sqlite3_file *psVar3;
  void *pArg;
  Btree *in_RSI;
  Btree *in_RDI;
  i64 nByte;
  sqlite3_backup b;
  sqlite3_file *pFd;
  int rc;
  sqlite3_backup *in_stack_ffffffffffffff98;
  int local_14;
  
  sqlite3BtreeEnter((Btree *)0x17d9a8);
  sqlite3BtreeEnter((Btree *)0x17d9b2);
  pPager = sqlite3BtreePager(in_RDI);
  psVar3 = sqlite3PagerFile(pPager);
  if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
    iVar1 = sqlite3BtreeGetPageSize(in_RSI);
    pArg = (void *)(long)iVar1;
    uVar2 = sqlite3BtreeLastPage((Btree *)0x17d9ee);
    local_14 = sqlite3OsFileControl
                         ((sqlite3_file *)in_stack_ffffffffffffff98,
                          (int)((long)pArg * (ulong)uVar2 >> 0x20),pArg);
    if (local_14 == 0xc) {
      local_14 = 0;
    }
    if (local_14 != 0) goto LAB_0017dabc;
  }
  memset(&stack0xffffffffffffff98,0,0x48);
  sqlite3_backup_step(b.pNext,b.isAttached);
  local_14 = sqlite3_backup_finish(in_stack_ffffffffffffff98);
  if (local_14 == 0) {
    in_RDI->pBt->btsFlags = in_RDI->pBt->btsFlags & 0xfffd;
  }
  else {
    sqlite3BtreePager(in_RDI);
    sqlite3PagerClearCache((Pager *)0x17daba);
  }
LAB_0017dabc:
  sqlite3BtreeLeave((Btree *)0x17dac6);
  sqlite3BtreeLeave((Btree *)0x17dad0);
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCopyFile(Btree *pTo, Btree *pFrom){
  int rc;
  sqlite3_file *pFd;              /* File descriptor for database pTo */
  sqlite3_backup b;
  sqlite3BtreeEnter(pTo);
  sqlite3BtreeEnter(pFrom);

  assert( sqlite3BtreeIsInTrans(pTo) );
  pFd = sqlite3PagerFile(sqlite3BtreePager(pTo));
  if( pFd->pMethods ){
    i64 nByte = sqlite3BtreeGetPageSize(pFrom)*(i64)sqlite3BtreeLastPage(pFrom);
    rc = sqlite3OsFileControl(pFd, SQLITE_FCNTL_OVERWRITE, &nByte);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
    if( rc ) goto copy_finished;
  }

  /* Set up an sqlite3_backup object. sqlite3_backup.pDestDb must be set
  ** to 0. This is used by the implementations of sqlite3_backup_step()
  ** and sqlite3_backup_finish() to detect that they are being called
  ** from this function, not directly by the user.
  */
  memset(&b, 0, sizeof(b));
  b.pSrcDb = pFrom->db;
  b.pSrc = pFrom;
  b.pDest = pTo;
  b.iNext = 1;

#ifdef SQLITE_HAS_CODEC
  sqlite3PagerAlignReserve(sqlite3BtreePager(pTo), sqlite3BtreePager(pFrom));
#endif

  /* 0x7FFFFFFF is the hard limit for the number of pages in a database
  ** file. By passing this as the number of pages to copy to
  ** sqlite3_backup_step(), we can guarantee that the copy finishes 
  ** within a single call (unless an error occurs). The assert() statement
  ** checks this assumption - (p->rc) should be set to either SQLITE_DONE 
  ** or an error code.  */
  sqlite3_backup_step(&b, 0x7FFFFFFF);
  assert( b.rc!=SQLITE_OK );

  rc = sqlite3_backup_finish(&b);
  if( rc==SQLITE_OK ){
    pTo->pBt->btsFlags &= ~BTS_PAGESIZE_FIXED;
  }else{
    sqlite3PagerClearCache(sqlite3BtreePager(b.pDest));
  }

  assert( sqlite3BtreeIsInTrans(pTo)==0 );
copy_finished:
  sqlite3BtreeLeave(pFrom);
  sqlite3BtreeLeave(pTo);
  return rc;
}